

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qcheckbox.cpp
# Opt level: O0

void QCheckBox::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined8 uVar1;
  bool bVar2;
  QtMocHelpers *in_RCX;
  int in_EDX;
  int in_ESI;
  void *_v_1;
  void *_v;
  QCheckBox *_t;
  undefined4 in_stack_ffffffffffffffac;
  int iVar3;
  undefined1 y;
  QCheckBox *in_stack_ffffffffffffffb0;
  
  y = (undefined1)((uint)in_stack_ffffffffffffffac >> 0x18);
  if (in_ESI == 0) {
    iVar3 = in_EDX;
    if (in_EDX == 0) {
      stateChanged((QCheckBox *)0x52e569,0);
    }
    else if (in_EDX == 1) {
      checkStateChanged((QCheckBox *)0x52e580,PartiallyChecked);
    }
    y = (undefined1)((uint)iVar3 >> 0x18);
  }
  if ((in_ESI != 5) ||
     ((bVar2 = QtMocHelpers::indexOfMethod<void(QCheckBox::*)(int)>
                         (in_RCX,(void **)stateChanged,0,0), !bVar2 &&
      (bVar2 = QtMocHelpers::indexOfMethod<void(QCheckBox::*)(Qt::CheckState)>
                         (in_RCX,(void **)checkStateChanged,0,1), !bVar2)))) {
    if ((in_ESI == 1) && (uVar1 = *(undefined8 *)in_RCX, in_EDX == 0)) {
      bVar2 = isTristate(in_stack_ffffffffffffffb0);
      *(bool *)uVar1 = bVar2;
    }
    if ((in_ESI == 2) && (in_EDX == 0)) {
      setTristate(*(QCheckBox **)in_RCX,(bool)y);
    }
  }
  return;
}

Assistant:

void QCheckBox::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QCheckBox *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->stateChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->checkStateChanged((*reinterpret_cast< std::add_pointer_t<Qt::CheckState>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QCheckBox::*)(int )>(_a, &QCheckBox::stateChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QCheckBox::*)(Qt::CheckState )>(_a, &QCheckBox::checkStateChanged, 1))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->isTristate(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setTristate(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}